

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall ncnn::Convolution_x86::create_pipeline(Convolution_x86 *this,Option *opt)

{
  Mat *this_00;
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  pointer pMVar4;
  void *pvVar5;
  size_t sVar6;
  int *piVar7;
  Allocator *pAVar8;
  size_t sVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  bool bVar32;
  byte bVar33;
  byte bVar34;
  int k_3;
  int iVar35;
  Layer *pLVar36;
  undefined4 *puVar37;
  long lVar38;
  void *pvVar39;
  undefined4 *puVar40;
  byte bVar41;
  byte bVar42;
  undefined4 uVar43;
  int iVar44;
  uint uVar45;
  pointer pMVar46;
  undefined1 (*pauVar47) [16];
  void *pvVar48;
  int p;
  int iVar49;
  pointer pMVar50;
  long lVar51;
  uint uVar52;
  long lVar53;
  int k_1;
  uint _h;
  undefined4 *puVar54;
  long lVar55;
  long lVar56;
  uint _w;
  ulong uVar57;
  long lVar58;
  _func_int **pp_Var59;
  ulong uVar60;
  void *pvVar61;
  int p_1;
  int iVar62;
  long lVar63;
  ulong uVar64;
  int k_2;
  _func_int **pp_Var65;
  long lVar66;
  void *pvVar67;
  void *pvVar68;
  int k_6;
  ulong uVar69;
  ulong uVar70;
  long lVar71;
  void *pvVar72;
  undefined4 *puVar73;
  ulong uVar74;
  void *pvVar75;
  uint uVar76;
  long lVar77;
  long lVar78;
  int i;
  _func_int **pp_Var79;
  ulong uVar80;
  void *pvVar81;
  int k;
  int iVar82;
  undefined1 (*pauVar83) [16];
  void *pvVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  void *local_1c8;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  ParamDict pd;
  undefined4 local_178;
  undefined4 uStack_174;
  Allocator *local_168;
  int iStack_160;
  int iStack_15c;
  int iStack_158;
  int iStack_154;
  int local_150 [2];
  size_t local_148;
  void *local_140;
  undefined4 uStack_138;
  undefined4 uStack_134;
  size_t local_130;
  int local_128;
  Allocator *local_120;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined8 uStack_110;
  int local_108;
  size_t local_100;
  ulong local_f0;
  void *local_e8;
  void *local_e0;
  long local_d8;
  void *local_d0;
  long local_c8;
  ulong local_c0;
  int TILE_M;
  int TILE_K;
  ulong local_a0;
  ParamDict pd_5;
  size_t local_88;
  Allocator *local_78;
  int local_70;
  int iStack_6c;
  undefined8 uStack_68;
  int local_60;
  size_t local_58;
  int TILE_N;
  
  if ((this->super_Convolution).dynamic_weight != 0) {
    return 0;
  }
  switch((this->super_Convolution).activation_type) {
  case 1:
    pLVar36 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar36->_vptr_Layer[2])(pLVar36,&pd);
    break;
  case 2:
    pLVar36 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    (*pLVar36->_vptr_Layer[2])(pLVar36,&pd);
    break;
  case 3:
    pLVar36 = create_layer_cpu(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_Convolution).activation_params.data + 4));
    (*pLVar36->_vptr_Layer[2])(pLVar36,&pd);
    break;
  case 4:
    pLVar36 = create_layer_cpu(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar36->_vptr_Layer[2])(pLVar36,&pd);
    break;
  case 5:
    pLVar36 = create_layer_cpu(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar36->_vptr_Layer[2])(pLVar36,&pd);
    break;
  case 6:
    pLVar36 = create_layer_cpu(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_Convolution).activation_params.data + 4));
    (*pLVar36->_vptr_Layer[2])(pLVar36,&pd);
    break;
  default:
    pLVar36 = (Layer *)0x0;
    goto LAB_0014ab56;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar36->_vptr_Layer[4])(pLVar36);
LAB_0014ab56:
  this->activation = pLVar36;
  this->nT = opt->num_threads;
  if ((opt->use_int8_inference == true) && ((this->super_Convolution).weight_data.elemsize == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  uVar3._0_4_ = (this->super_Convolution).kernel_w;
  uVar3._4_4_ = (this->super_Convolution).kernel_h;
  uVar64 = (long)(this->super_Convolution).weight_data_size /
           (long)(int)(uVar3._4_4_ * (undefined4)uVar3);
  uVar45 = (this->super_Convolution).num_output;
  uVar64 = (long)((ulong)(uint)((int)uVar64 >> 0x1f) << 0x20 | uVar64 & 0xffffffff) /
           (long)(int)uVar45;
  bVar41 = (undefined4)uVar3 != uVar3._4_4_ | opt->use_packing_layout;
  uVar69 = CONCAT71((int7)((ulong)uVar3 >> 8),bVar41);
  if (bVar41 == 0) {
    uVar52 = (this->super_Convolution).dilation_w;
    uVar69 = (ulong)uVar52;
    if ((((uVar52 != 1) && ((this->super_Convolution).dilation_h == uVar52)) &&
        ((this->super_Convolution).stride_w == 1)) && ((this->super_Convolution).stride_h == 1)) {
      pLVar36 = create_layer_cpu(6);
      this->convolution_dilation1 = pLVar36;
      ParamDict::ParamDict(&pd_5);
      ParamDict::set(&pd_5,0,(this->super_Convolution).num_output);
      ParamDict::set(&pd_5,1,(this->super_Convolution).kernel_w);
      ParamDict::set(&pd_5,0xb,(this->super_Convolution).kernel_h);
      ParamDict::set(&pd_5,2,1);
      ParamDict::set(&pd_5,0xc,1);
      ParamDict::set(&pd_5,3,1);
      ParamDict::set(&pd_5,0xd,1);
      ParamDict::set(&pd_5,4,0);
      ParamDict::set(&pd_5,0xe,0);
      ParamDict::set(&pd_5,5,(this->super_Convolution).bias_term);
      ParamDict::set(&pd_5,6,(this->super_Convolution).weight_data_size);
      (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
      if ((this->super_Convolution).bias_term == 0) {
        local_148 = 0;
        pd._vptr_ParamDict = (_func_int **)0x0;
        pd.d._0_4_ = 0;
        pd.d._4_4_ = 0;
        local_168 = (Allocator *)0x0;
        iStack_160 = 0;
        iStack_15c = 0;
        iStack_158 = 0;
        iStack_154 = 0;
        local_150[0] = 0;
        if ((Mat *)&pd != &(this->super_Convolution).weight_data) {
          piVar7 = (this->super_Convolution).weight_data.refcount;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + 1;
            UNLOCK();
          }
          pd._vptr_ParamDict = (_func_int **)(this->super_Convolution).weight_data.data;
          piVar7 = (this->super_Convolution).weight_data.refcount;
          pd.d._0_4_ = SUB84(piVar7,0);
          pd.d._4_4_ = (undefined4)((ulong)piVar7 >> 0x20);
          local_168 = (this->super_Convolution).weight_data.allocator;
          uVar28 = (this->super_Convolution).weight_data.dims;
          uVar29 = (this->super_Convolution).weight_data.w;
          uVar30 = (this->super_Convolution).weight_data.h;
          uVar31 = (this->super_Convolution).weight_data.d;
          local_150[0] = (this->super_Convolution).weight_data.c;
          local_148 = (this->super_Convolution).weight_data.cstep;
          iStack_160 = uVar28;
          iStack_15c = uVar29;
          iStack_158 = uVar30;
          iStack_154 = uVar31;
        }
        pLVar36 = this->convolution_dilation1;
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M,(Mat *)&pd);
        (*pLVar36->_vptr_Layer[3])(pLVar36,&TILE_M);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M);
        piVar7 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_168 == (Allocator *)0x0) {
              free(pd._vptr_ParamDict);
            }
            else {
              (*local_168->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        local_148 = 0;
        pd._vptr_ParamDict = (_func_int **)0x0;
        pd.d._0_4_ = 0;
        pd.d._4_4_ = 0;
        local_168 = (Allocator *)0x0;
        iStack_160 = 0;
        iStack_15c = 0;
        iStack_158 = 0;
        iStack_154 = 0;
        local_150[0] = 0;
        if ((Mat *)&pd != &(this->super_Convolution).weight_data) {
          piVar7 = (this->super_Convolution).weight_data.refcount;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + 1;
            UNLOCK();
          }
          pd._vptr_ParamDict = (_func_int **)(this->super_Convolution).weight_data.data;
          piVar7 = (this->super_Convolution).weight_data.refcount;
          pd.d._0_4_ = SUB84(piVar7,0);
          pd.d._4_4_ = (undefined4)((ulong)piVar7 >> 0x20);
          local_168 = (this->super_Convolution).weight_data.allocator;
          uVar22 = (this->super_Convolution).weight_data.dims;
          uVar23 = (this->super_Convolution).weight_data.w;
          uVar24 = (this->super_Convolution).weight_data.h;
          uVar25 = (this->super_Convolution).weight_data.d;
          local_150[0] = (this->super_Convolution).weight_data.c;
          local_148 = (this->super_Convolution).weight_data.cstep;
          iStack_160 = uVar22;
          iStack_15c = uVar23;
          iStack_158 = uVar24;
          iStack_154 = uVar25;
        }
        local_100 = 0;
        local_108 = 0;
        uStack_110 = 0;
        uStack_114 = 0;
        uStack_118 = 0;
        local_120 = (Allocator *)0x0;
        local_128 = 0;
        local_130 = 0;
        uStack_134 = 0;
        uStack_138 = 0;
        local_140 = (void *)0x0;
        if ((Mat *)&local_140 != &(this->super_Convolution).bias_data) {
          piVar7 = (this->super_Convolution).bias_data.refcount;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + 1;
            UNLOCK();
          }
          local_140 = (this->super_Convolution).bias_data.data;
          piVar7 = (this->super_Convolution).bias_data.refcount;
          uStack_138 = SUB84(piVar7,0);
          uStack_134 = (undefined4)((ulong)piVar7 >> 0x20);
          local_130 = (this->super_Convolution).bias_data.elemsize;
          local_128 = (this->super_Convolution).bias_data.elempack;
          local_120 = (this->super_Convolution).bias_data.allocator;
          uVar26 = (this->super_Convolution).bias_data.dims;
          uVar27 = (this->super_Convolution).bias_data.w;
          uStack_110._0_4_ = (this->super_Convolution).bias_data.h;
          uStack_110._4_4_ = (this->super_Convolution).bias_data.d;
          local_108 = (this->super_Convolution).bias_data.c;
          local_100 = (this->super_Convolution).bias_data.cstep;
          uStack_118 = uVar26;
          uStack_114 = uVar27;
        }
        pLVar36 = this->convolution_dilation1;
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M,(Mat *)&pd);
        (*pLVar36->_vptr_Layer[3])(pLVar36,&TILE_M);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M);
        lVar77 = 0x48;
        do {
          piVar7 = *(int **)((long)&pd.d + lVar77);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (*(long **)((long)&local_168 + lVar77) == (long *)0x0) {
                free(*(void **)((long)&pd._vptr_ParamDict + lVar77));
              }
              else {
                (**(code **)(**(long **)((long)&local_168 + lVar77) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_148 + lVar77) = 0;
          *(undefined1 (*) [16])((long)&pd.d + lVar77 + 4) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&pd._vptr_ParamDict + lVar77) = (undefined1  [16])0x0;
          *(undefined4 *)((long)local_150 + lVar77) = 0;
          *(undefined1 (*) [16])((long)&iStack_160 + lVar77) = (undefined1  [16])0x0;
          lVar77 = lVar77 + -0x48;
        } while (lVar77 != -0x48);
      }
      (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
      if (opt->lightmode == true) {
        piVar7 = (this->super_Convolution).weight_data.refcount;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            pAVar8 = (this->super_Convolution).weight_data.allocator;
            if (pAVar8 == (Allocator *)0x0) {
              free((this->super_Convolution).weight_data.data);
            }
            else {
              (*pAVar8->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Convolution).weight_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Convolution).weight_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Convolution).weight_data.data = (void *)0x0;
        (this->super_Convolution).weight_data.refcount = (int *)0x0;
        (this->super_Convolution).weight_data.dims = 0;
        (this->super_Convolution).weight_data.w = 0;
        (this->super_Convolution).weight_data.h = 0;
        (this->super_Convolution).weight_data.d = 0;
        (this->super_Convolution).weight_data.c = 0;
      }
      ParamDict::~ParamDict(&pd_5);
      return 0;
    }
  }
  uVar43 = (undefined4)uVar69;
  if (opt->use_packing_layout == false) {
    uVar52 = 1;
    uVar60 = 1;
  }
  else {
    uVar52 = (uint)((uVar64 & 3) == 0) * 3 + 1;
    uVar60 = (ulong)((uint)((uVar45 & 3) == 0) * 3 + 1);
  }
  bVar41 = opt->use_winograd23_convolution;
  _h = (uint)uVar64;
  if ((((bool)bVar41 == false) && (opt->use_winograd43_convolution == false)) &&
     (opt->use_winograd63_convolution != true)) {
    bVar32 = false;
  }
  else {
    uVar43 = (undefined4)CONCAT71((int7)(uVar69 >> 8),8 < (int)_h);
    bVar32 = 8 < (int)uVar45 || 8 < (int)_h;
  }
  auVar85._0_4_ = -(uint)((undefined4)uVar3 == 3);
  auVar85._4_4_ = -(uint)(uVar3._4_4_ == 3);
  auVar85._8_4_ = -(uint)((this->super_Convolution).dilation_w == 1);
  auVar85._12_4_ = -(uint)((this->super_Convolution).dilation_h == 1);
  iVar44 = movmskps(uVar43,auVar85);
  if (((iVar44 != 0xf) || ((this->super_Convolution).stride_w != 1)) ||
     (((this->super_Convolution).stride_h != 1 ||
      ((opt->use_winograd_convolution == false || (!bVar32)))))) {
    iVar35 = get_cpu_level2_cache_size();
    uVar45 = (this->super_Convolution).num_output;
    iVar44 = (this->super_Convolution).kernel_w;
    uVar69 = (ulong)(int)uVar45;
    iVar82 = (this->super_Convolution).kernel_h;
    iVar49 = (this->super_Convolution).dilation_w;
    iVar62 = (this->super_Convolution).dilation_h;
    iVar1 = (this->super_Convolution).stride_w;
    iVar2 = (this->super_Convolution).stride_h;
    if (((opt->use_sgemm_convolution != true) ||
        ((int)(uVar45 * iVar44 * iVar82 * iVar49 * iVar62 * iVar1 * iVar2 * _h * 8) <= iVar35 &&
         ((int)_h < 0x11 && (int)uVar45 < 0x11))) && (iVar82 != 1 || iVar44 != 1)) {
      iVar35 = (int)uVar60;
      if (((iVar1 == 1 &&
           (iVar62 == 1 &&
           ((iVar49 == 1 && iVar82 == 3) && (iVar44 == 3 && (iVar35 == 4 && uVar52 == 1))))) &&
           iVar2 == 1) ||
         ((iVar62 == 1 &&
          ((iVar49 == 1 && iVar82 == 3) && (iVar44 == 3 && (iVar35 == 4 && uVar52 == 1)))) &&
          (iVar2 == 2 && iVar1 == 2))) {
        uVar76 = iVar82 * iVar44;
        uVar74 = 0;
        Mat::reshape((Mat *)&pd,&(this->super_Convolution).weight_data,uVar76,_h,uVar45,
                     (Allocator *)0x0);
        Mat::create(&this->weight_data_tm,uVar76,
                    (int)((long)((ulong)(uint)((int)_h >> 0x1f) << 0x20 | uVar64 & 0xffffffff) /
                         (long)(int)uVar52),(int)uVar45 / iVar35,(ulong)(iVar35 * uVar52 * 4),
                    iVar35 * uVar52,(Allocator *)0x0);
        pvVar5 = (this->weight_data_tm).data;
        sVar9 = (this->weight_data_tm).elemsize;
        sVar6 = (this->weight_data_tm).cstep;
        uVar64 = (ulong)uVar76;
        if ((int)uVar76 < 1) {
          uVar64 = uVar74;
        }
        for (; (long)uVar74 < (long)(uVar69 - (iVar35 - 1)); uVar74 = uVar74 + uVar60) {
          puVar37 = (undefined4 *)
                    ((long)(int)((long)((ulong)(uint)((int)uVar74 >> 0x1f) << 0x20 |
                                       uVar74 & 0xffffffff) / (long)iVar35) * sVar9 * sVar6 +
                    (long)pvVar5);
          for (lVar77 = 0; lVar77 < (long)((long)(int)_h - (ulong)(uVar52 - 1));
              lVar77 = lVar77 + (ulong)uVar52) {
            lVar66 = 0;
            for (uVar70 = 0; uVar70 != uVar64; uVar70 = uVar70 + 1) {
              lVar55 = lVar77;
              for (uVar80 = 0; uVar80 != uVar52; uVar80 = uVar80 + 1) {
                puVar54 = (undefined4 *)
                          ((long)pd._vptr_ParamDict +
                          (iStack_15c * lVar55 + uVar74 * local_148) *
                          CONCAT44(uStack_174,local_178) + lVar66);
                uVar57 = uVar60;
                while (bVar32 = uVar57 != 0, uVar57 = uVar57 - 1, bVar32) {
                  *puVar37 = *puVar54;
                  puVar37 = puVar37 + 1;
                  puVar54 = (undefined4 *)
                            ((long)puVar54 + CONCAT44(uStack_174,local_178) * local_148);
                }
                lVar55 = lVar55 + 1;
              }
              lVar66 = lVar66 + 4;
            }
          }
        }
        piVar7 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_168 == (Allocator *)0x0) {
              free(pd._vptr_ParamDict);
            }
            else {
              (*local_168->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        uVar76 = iVar82 * iVar44;
        uVar52 = _h;
        if ((int)uVar45 < 4) {
          if ((int)uVar45 < 2) {
            if ((int)_h < 4) {
              _w = uVar76;
              if (1 < (int)_h) {
                _w = uVar76 * 2;
                uVar52 = (_h & 1) + 1;
              }
            }
            else {
              _w = uVar76 * 4;
              uVar52 = (_h & 1) + ((uint)(uVar64 >> 2) & 0x3fffffff) + (uint)((_h >> 1 & 1) != 0);
            }
          }
          else if ((int)_h < 4) {
            if ((int)_h < 2) {
              uVar45 = (uVar45 & 1) + 1;
              _w = uVar76 * 2;
            }
            else {
              _w = uVar76 * 4;
              uVar52 = (_h & 1) + 1;
              uVar45 = (uVar45 & 1) + 1;
            }
          }
          else {
            _w = uVar76 * 8;
            uVar52 = (_h & 1) + ((uint)(uVar64 >> 2) & 0x3fffffff) + (uint)((_h >> 1 & 1) != 0);
            uVar45 = (uVar45 & 1) + 1;
          }
        }
        else if ((int)_h < 4) {
          if ((int)_h < 2) {
            uVar45 = (uVar45 & 1) + ((uint)(uVar69 >> 2) & 0x3fffffff) +
                     (uint)((uVar45 >> 1 & 1) != 0);
            _w = uVar76 * 4;
          }
          else {
            uVar45 = (uVar45 & 1) + (uVar45 >> 2) + (uint)((uVar45 >> 1 & 1) != 0);
            _w = uVar76 * 8;
            uVar52 = (_h & 1) + 1;
          }
        }
        else {
          _w = uVar76 * 0x10;
          uVar52 = (_h & 1) + ((uint)(uVar64 >> 2) & 0x3fffffff) + (uint)((_h >> 1 & 1) != 0);
          uVar45 = (uVar45 & 1) + ((uint)(uVar69 >> 2) & 0x3fffffff) +
                   (uint)((uVar45 >> 1 & 1) != 0);
        }
        Mat::create(&this->weight_data_tm,_w,uVar52,uVar45,4,(Allocator *)0x0);
        pvVar5 = (this->super_Convolution).weight_data.data;
        pvVar68 = (this->weight_data_tm).data;
        sVar9 = (this->weight_data_tm).elemsize;
        sVar6 = (this->weight_data_tm).cstep;
        local_a0 = (ulong)(int)uVar76;
        local_f0 = (ulong)(int)(uVar76 * 2);
        uVar64 = 0;
        if (0 < (int)uVar76) {
          uVar64 = (ulong)uVar76;
        }
        iVar62 = uVar76 * _h;
        iVar49 = iVar62 * 4;
        lVar55 = (long)(int)(uVar76 * 4) * 4;
        lVar77 = local_a0 * 4;
        iVar82 = iVar62 * 2;
        iVar44 = iVar62 * 3;
        local_c8 = local_f0 * 4;
        lVar66 = uVar64 * 4;
        uVar60 = 0;
        for (uVar74 = 0; uVar70 = uVar60, (long)(uVar74 | 3) < (long)uVar69; uVar74 = uVar74 + 4) {
          pvVar39 = (void *)((long)pvVar5 + (long)(int)uVar70 * 4);
          pvVar48 = (void *)((long)pvVar5 + (long)iVar62 * 4);
          pvVar61 = (void *)((long)pvVar5 + (long)iVar82 * 4);
          local_d8 = CONCAT44(local_d8._4_4_,iVar44);
          pvVar75 = (void *)((long)pvVar5 + (long)iVar44 * 4);
          pvVar67 = (void *)((uVar74 >> 2) * sVar9 * sVar6 + (long)pvVar68);
          lVar53 = 0;
          pvVar72 = pvVar48;
          pvVar81 = pvVar39;
          pvVar84 = pvVar61;
          local_1c8 = pvVar75;
          for (uVar45 = 0; (int)(uVar45 | 3) < (int)_h; uVar45 = uVar45 + 4) {
            lVar38 = lVar53;
            for (uVar60 = 0; uVar60 != uVar64; uVar60 = uVar60 + 1) {
              lVar51 = lVar38;
              for (lVar56 = 0; (int)lVar56 != 0x40; lVar56 = lVar56 + 0x10) {
                *(undefined4 *)((long)pvVar67 + lVar56) = *(undefined4 *)((long)pvVar39 + lVar51);
                *(undefined4 *)((long)pvVar67 + lVar56 + 4) =
                     *(undefined4 *)((long)pvVar48 + lVar51);
                *(undefined4 *)((long)pvVar67 + lVar56 + 8) =
                     *(undefined4 *)((long)pvVar61 + lVar51);
                *(undefined4 *)((long)pvVar67 + lVar56 + 0xc) =
                     *(undefined4 *)((long)pvVar75 + lVar51);
                lVar51 = lVar51 + lVar77;
              }
              lVar38 = lVar38 + 4;
              pvVar67 = (void *)((long)pvVar67 + lVar56);
            }
            lVar53 = lVar53 + lVar55;
            pvVar81 = (void *)((long)pvVar81 + lVar55);
            pvVar72 = (void *)((long)pvVar72 + lVar55);
            pvVar84 = (void *)((long)pvVar84 + lVar55);
            local_1c8 = (void *)((long)local_1c8 + lVar55);
          }
          for (; (int)(uVar45 | 1) < (int)_h; uVar45 = uVar45 + 2) {
            pvVar39 = local_1c8;
            pvVar48 = pvVar84;
            pvVar61 = pvVar72;
            pvVar75 = pvVar81;
            for (uVar60 = 0; uVar60 != uVar64; uVar60 = uVar60 + 1) {
              lVar53 = 0;
              for (lVar38 = 0; (int)lVar38 != 0x20; lVar38 = lVar38 + 0x10) {
                *(undefined4 *)((long)pvVar67 + lVar38) = *(undefined4 *)((long)pvVar75 + lVar53);
                *(undefined4 *)((long)pvVar67 + lVar38 + 4) =
                     *(undefined4 *)((long)pvVar61 + lVar53);
                *(undefined4 *)((long)pvVar67 + lVar38 + 8) =
                     *(undefined4 *)((long)pvVar48 + lVar53);
                *(undefined4 *)((long)pvVar67 + lVar38 + 0xc) =
                     *(undefined4 *)((long)pvVar39 + lVar53);
                lVar53 = lVar53 + lVar77;
              }
              pvVar75 = (void *)((long)pvVar75 + 4);
              pvVar61 = (void *)((long)pvVar61 + 4);
              pvVar48 = (void *)((long)pvVar48 + 4);
              pvVar39 = (void *)((long)pvVar39 + 4);
              pvVar67 = (void *)((long)pvVar67 + lVar38);
            }
            pvVar81 = (void *)((long)pvVar81 + local_c8);
            pvVar72 = (void *)((long)pvVar72 + local_c8);
            pvVar84 = (void *)((long)pvVar84 + local_c8);
            local_1c8 = (void *)((long)local_1c8 + local_c8);
          }
          for (; (int)uVar45 < (int)_h; uVar45 = uVar45 + 1) {
            pvVar39 = pvVar67;
            for (lVar53 = 0; lVar66 != lVar53; lVar53 = lVar53 + 4) {
              *(undefined4 *)((long)pvVar67 + lVar53 * 4) = *(undefined4 *)((long)pvVar81 + lVar53);
              *(undefined4 *)((long)pvVar67 + lVar53 * 4 + 4) =
                   *(undefined4 *)((long)pvVar72 + lVar53);
              *(undefined4 *)((long)pvVar67 + lVar53 * 4 + 8) =
                   *(undefined4 *)((long)pvVar84 + lVar53);
              *(undefined4 *)((long)pvVar67 + lVar53 * 4 + 0xc) =
                   *(undefined4 *)((long)local_1c8 + lVar53);
              pvVar39 = (void *)((long)pvVar39 + 0x10);
            }
            pvVar67 = pvVar39;
          }
          iVar62 = iVar62 + iVar49;
          iVar82 = iVar82 + iVar49;
          iVar44 = iVar44 + iVar49;
          uVar60 = (ulong)(uint)((int)uVar70 + iVar49);
          local_c0 = uVar70;
        }
        pvVar5 = (this->super_Convolution).weight_data.data;
        sVar9 = (this->weight_data_tm).elemsize;
        sVar6 = (this->weight_data_tm).cstep;
        local_d0 = (this->weight_data_tm).data;
        iVar44 = uVar76 * _h * 2;
        local_d8 = CONCAT44(local_d8._4_4_,iVar44);
        local_e0 = (void *)((long)pvVar5 + (long)(int)(uVar76 * 3) * 4);
        local_e8 = (void *)((long)pvVar5 + local_f0 * 4);
        for (; uVar60 = uVar70, (long)(uVar74 | 1) < (long)uVar69; uVar74 = uVar74 + 2) {
          lVar38 = (long)iVar62;
          pvVar68 = (void *)((long)local_e0 + lVar38 * 4);
          pvVar39 = (void *)((long)local_e8 + lVar38 * 4);
          lVar53 = (long)pvVar5 + lVar38 * 4 + local_a0 * 4;
          pvVar48 = (void *)((long)pvVar5 + lVar38 * 4);
          lVar38 = (long)(int)uVar60;
          pvVar61 = (void *)((long)local_e0 + lVar38 * 4);
          pvVar75 = (void *)((long)local_e8 + lVar38 * 4);
          lVar51 = (long)pvVar5 + lVar38 * 4 + local_a0 * 4;
          pvVar67 = (void *)((long)pvVar5 + lVar38 * 4);
          puVar37 = (undefined4 *)
                    ((ulong)(((uint)(uVar74 >> 2) & 0x3fffffff) +
                            (uint)(((uint)uVar74 >> 1 & 1) != 0)) * sVar9 * sVar6 + (long)local_d0);
          for (uVar45 = 0; (int)(uVar45 | 3) < (int)_h; uVar45 = uVar45 + 4) {
            puVar54 = puVar37;
            for (lVar38 = 0; lVar66 != lVar38; lVar38 = lVar38 + 4) {
              puVar37[lVar38 * 2] = *(undefined4 *)((long)pvVar67 + lVar38);
              puVar37[lVar38 * 2 + 1] = *(undefined4 *)(lVar51 + lVar38);
              puVar37[lVar38 * 2 + 2] = *(undefined4 *)((long)pvVar75 + lVar38);
              puVar37[lVar38 * 2 + 3] = *(undefined4 *)((long)pvVar61 + lVar38);
              puVar37[lVar38 * 2 + 4] = *(undefined4 *)((long)pvVar48 + lVar38);
              puVar37[lVar38 * 2 + 5] = *(undefined4 *)(lVar53 + lVar38);
              puVar37[lVar38 * 2 + 6] = *(undefined4 *)((long)pvVar39 + lVar38);
              puVar37[lVar38 * 2 + 7] = *(undefined4 *)((long)pvVar68 + lVar38);
              puVar54 = puVar54 + 8;
            }
            pvVar67 = (void *)((long)pvVar67 + lVar55);
            pvVar48 = (void *)((long)pvVar48 + lVar55);
            pvVar68 = (void *)((long)pvVar68 + lVar55);
            pvVar39 = (void *)((long)pvVar39 + lVar55);
            lVar53 = lVar53 + lVar55;
            pvVar61 = (void *)((long)pvVar61 + lVar55);
            pvVar75 = (void *)((long)pvVar75 + lVar55);
            lVar51 = lVar51 + lVar55;
            puVar37 = puVar54;
          }
          for (; (int)(uVar45 | 1) < (int)_h; uVar45 = uVar45 + 2) {
            pvVar68 = pvVar48;
            pvVar39 = pvVar67;
            for (uVar70 = 0; uVar70 != uVar64; uVar70 = uVar70 + 1) {
              lVar38 = 0;
              for (lVar53 = 0; (int)lVar53 != 0x10; lVar53 = lVar53 + 8) {
                *(undefined4 *)((long)puVar37 + lVar53) = *(undefined4 *)((long)pvVar39 + lVar38);
                *(undefined4 *)((long)puVar37 + lVar53 + 4) =
                     *(undefined4 *)((long)pvVar68 + lVar38);
                lVar38 = lVar38 + lVar77;
              }
              puVar37 = (undefined4 *)((long)puVar37 + lVar53);
              pvVar39 = (void *)((long)pvVar39 + 4);
              pvVar68 = (void *)((long)pvVar68 + 4);
            }
            pvVar67 = (void *)((long)pvVar67 + local_c8);
            pvVar48 = (void *)((long)pvVar48 + local_c8);
          }
          for (; (int)uVar45 < (int)_h; uVar45 = uVar45 + 1) {
            for (uVar70 = 0; uVar64 != uVar70; uVar70 = uVar70 + 1) {
              *puVar37 = *(undefined4 *)((long)pvVar67 + uVar70 * 4);
              puVar37[1] = *(undefined4 *)((long)pvVar48 + uVar70 * 4);
              puVar37 = puVar37 + 2;
            }
          }
          iVar62 = iVar62 + iVar44;
          uVar70 = (ulong)(uint)((int)uVar60 + iVar44);
          local_c0 = uVar60;
        }
        pvVar5 = (this->super_Convolution).weight_data.data;
        pvVar68 = (this->weight_data_tm).data;
        sVar9 = (this->weight_data_tm).elemsize;
        sVar6 = (this->weight_data_tm).cstep;
        for (; (long)uVar74 < (long)uVar69; uVar74 = uVar74 + 1) {
          iVar44 = (int)uVar60;
          lVar77 = (long)pvVar5 + (long)iVar44 * 4 + local_a0 * 4;
          puVar37 = (undefined4 *)((long)pvVar5 + (long)iVar44 * 4);
          puVar54 = (undefined4 *)
                    ((ulong)(((uint)uVar74 & 1) + ((uint)(uVar74 >> 2) & 0x3fffffff) +
                            (uint)(((uint)uVar74 >> 1 & 1) != 0)) * sVar9 * sVar6 + (long)pvVar68);
          for (uVar45 = 0; (int)(uVar45 | 3) < (int)_h; uVar45 = uVar45 + 4) {
            puVar40 = puVar37;
            for (uVar60 = 0; uVar60 != uVar64; uVar60 = uVar60 + 1) {
              puVar73 = puVar40;
              for (lVar53 = 0; (int)lVar53 != 0x10; lVar53 = lVar53 + 4) {
                *(undefined4 *)((long)puVar54 + lVar53) = *puVar73;
                puVar73 = puVar73 + local_a0;
              }
              puVar54 = (undefined4 *)((long)puVar54 + lVar53);
              puVar40 = puVar40 + 1;
            }
            puVar37 = puVar37 + (int)(uVar76 * 4);
            lVar77 = lVar77 + lVar55;
          }
          for (; (int)(uVar45 | 1) < (int)_h; uVar45 = uVar45 + 2) {
            for (uVar60 = 0; uVar64 != uVar60; uVar60 = uVar60 + 1) {
              *puVar54 = puVar37[uVar60];
              puVar54[1] = *(undefined4 *)(lVar77 + uVar60 * 4);
              puVar54 = puVar54 + 2;
            }
            puVar37 = puVar37 + local_f0;
            lVar77 = lVar77 + local_c8;
          }
          for (; (int)uVar45 < (int)_h; uVar45 = uVar45 + 1) {
            for (lVar77 = 0; lVar66 != lVar77; lVar77 = lVar77 + 4) {
              *(undefined4 *)((long)puVar54 + lVar77) = *(undefined4 *)((long)puVar37 + lVar77);
            }
            puVar54 = (undefined4 *)((long)puVar54 + lVar77);
          }
          uVar60 = (ulong)(iVar44 + uVar76 * _h);
        }
      }
      if (opt->lightmode != true) {
        return 0;
      }
      piVar7 = (this->super_Convolution).weight_data.refcount;
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          pAVar8 = (this->super_Convolution).weight_data.allocator;
          if (pAVar8 == (Allocator *)0x0) {
            free((this->super_Convolution).weight_data.data);
          }
          else {
            (*pAVar8->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_Convolution).weight_data.cstep = 0;
      *(undefined8 *)((long)&(this->super_Convolution).weight_data.refcount + 4) = 0;
      *(undefined8 *)((long)&(this->super_Convolution).weight_data.elemsize + 4) = 0;
      (this->super_Convolution).weight_data.data = (void *)0x0;
      (this->super_Convolution).weight_data.refcount = (int *)0x0;
      (this->super_Convolution).weight_data.dims = 0;
      (this->super_Convolution).weight_data.w = 0;
      (this->super_Convolution).weight_data.h = 0;
      (this->super_Convolution).weight_data.d = 0;
      (this->super_Convolution).weight_data.c = 0;
      return 0;
    }
    this_00 = &(this->super_Convolution).weight_data;
    uVar76 = iVar82 * iVar44;
    iVar44 = _h * uVar76;
    convolution_im2col_gemm_get_optimal_tile_mnk
              (uVar45,0,iVar44,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
    local_f0 = (long)(int)(TILE_M + uVar45 + -1) / (long)TILE_M & 0xffffffff;
    uVar52 = 1;
    if ((uVar64 & 3) == 0) {
      uVar52 = (uint)opt->use_packing_layout * 3 + 1;
    }
    local_148 = 0;
    pd._vptr_ParamDict = (_func_int **)0x0;
    pd.d._0_4_ = 0;
    pd.d._4_4_ = 0;
    local_168 = (Allocator *)0x0;
    iStack_160 = 0;
    iStack_15c = 0;
    iStack_158 = 0;
    iStack_154 = 0;
    local_150[0] = 0;
    if (uVar76 == 1) {
      Mat::reshape((Mat *)&pd_5,this_00,iVar44,uVar45,(Allocator *)0x0);
      if (pd_5.d != (ParamDictPrivate *)0x0) {
        LOCK();
        (pd_5.d)->params[0].type = (pd_5.d)->params[0].type + 1;
        UNLOCK();
      }
      piVar7 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_168 == (Allocator *)0x0) {
            free(pd._vptr_ParamDict);
          }
          else {
            (*local_168->_vptr_Allocator[3])();
          }
        }
      }
      pd._vptr_ParamDict = pd_5._vptr_ParamDict;
      pd.d._0_4_ = SUB84(pd_5.d,0);
      pd.d._4_4_ = (undefined4)((ulong)pd_5.d >> 0x20);
      local_168 = local_78;
      iStack_160 = local_70;
      iStack_15c = iStack_6c;
      iStack_158 = (int)uStack_68;
      iStack_154 = SUB84(uStack_68,4);
      local_150[0] = local_60;
      local_148 = local_58;
      if (pd_5.d == (ParamDictPrivate *)0x0) goto LAB_0014b7ce;
      LOCK();
      (pd_5.d)->params[0].type = (pd_5.d)->params[0].type + -1;
      UNLOCK();
      if ((pd_5.d)->params[0].type != 0) goto LAB_0014b7ce;
      if (local_78 != (Allocator *)0x0) {
        (*local_78->_vptr_Allocator[3])();
        goto LAB_0014b7ce;
      }
    }
    else {
      Mat::reshape((Mat *)&pd_5,this_00,uVar76,_h,uVar45,(Allocator *)0x0);
      uVar69 = 0;
      Mat::create((Mat *)&pd,iVar44,uVar45,4,(Allocator *)0x0);
      uVar64 = (ulong)uVar76;
      if ((int)uVar76 < 1) {
        uVar64 = uVar69;
      }
      uVar60 = 0;
      if (0 < (int)uVar45) {
        uVar60 = (ulong)uVar45;
      }
      for (; uVar69 != uVar60; uVar69 = uVar69 + 1) {
        pp_Var59 = pd._vptr_ParamDict;
        for (lVar77 = 0; lVar77 < (long)((long)(int)_h - (ulong)(uVar52 - 1));
            lVar77 = lVar77 + (ulong)uVar52) {
          pp_Var65 = (_func_int **)
                     ((iStack_6c * lVar77 + local_58 * uVar69) * local_88 +
                     (long)pd_5._vptr_ParamDict);
          for (uVar74 = 0; pp_Var79 = pp_Var65, uVar70 = (ulong)uVar52, uVar74 != uVar64;
              uVar74 = uVar74 + 1) {
            while (uVar70 != 0) {
              *(undefined4 *)pp_Var59 = *(undefined4 *)pp_Var79;
              pp_Var59 = (_func_int **)((long)pp_Var59 + 4);
              pp_Var79 = (_func_int **)((long)pp_Var79 + local_88 * (long)iStack_6c);
              uVar70 = uVar70 - 1;
            }
            pp_Var65 = (_func_int **)((long)pp_Var65 + 4);
          }
        }
      }
      if (pd_5.d == (ParamDictPrivate *)0x0) goto LAB_0014b7ce;
      LOCK();
      (pd_5.d)->params[0].type = (pd_5.d)->params[0].type + -1;
      UNLOCK();
      if ((pd_5.d)->params[0].type != 0) goto LAB_0014b7ce;
      if (local_78 != (Allocator *)0x0) {
        (*local_78->_vptr_Allocator[3])();
        goto LAB_0014b7ce;
      }
    }
    free(pd_5._vptr_ParamDict);
LAB_0014b7ce:
    iVar82 = TILE_M;
    lVar77 = (long)TILE_M;
    local_190 = 4;
    Mat::create(&this->weight_sgemm_data,TILE_M * TILE_K,(iVar44 + TILE_K + -1) / TILE_K,
                (int)((uVar45 - 1) + TILE_M) / TILE_M,4,(Allocator *)0x0);
    local_c0 = (ulong)iVar44;
    iVar49 = (int)local_f0;
    local_f0 = local_f0 & 0xffffffff;
    if (iVar49 < 1) {
      local_f0 = 0;
    }
    lVar66 = lVar77 * 4;
    local_198 = 0xc;
    local_1a0 = 8;
    uVar64 = 0;
    lVar55 = 0;
    while (lVar53 = lVar55, uVar69 = uVar64, uVar69 != local_f0) {
      local_d0 = (void *)(uVar69 * lVar77);
      iVar49 = uVar45 - (int)local_d0;
      if (iVar82 < iVar49) {
        iVar49 = iVar82;
      }
      local_d8 = (long)TILE_K;
      local_e0 = (void *)CONCAT44(local_e0._4_4_,TILE_M);
      lVar55 = (long)iVar49;
      local_e8 = (void *)(local_d8 * 4);
      local_1a8 = 0;
      for (uVar64 = 0; (long)uVar64 < (long)local_c0; uVar64 = uVar64 + local_d8) {
        iVar49 = iVar44 - (int)uVar64;
        if (TILE_K < iVar49) {
          iVar49 = TILE_K;
        }
        sVar9 = (this->weight_sgemm_data).elemsize;
        lVar58 = (long)iStack_15c;
        lVar63 = local_198 * lVar58 + local_1a8;
        lVar38 = lVar58 * 0x10;
        lVar56 = local_1a0 * lVar58 + local_1a8;
        lVar78 = local_190 * lVar58 + local_1a8;
        lVar51 = lVar53 * lVar58 + local_1a8;
        pauVar83 = (undefined1 (*) [16])
                   ((long)(this->weight_sgemm_data).data +
                   (long)(this->weight_sgemm_data).w * sVar9 *
                   (long)(int)((long)((ulong)(uint)((int)uVar64 >> 0x1f) << 0x20 |
                                     uVar64 & 0xffffffff) / (long)TILE_K) +
                   (long)(int)((long)((ulong)(uint)((int)local_d0 >> 0x1f) << 0x20 |
                                     (ulong)local_d0 & 0xffffffff) / (long)TILE_M) *
                   (this->weight_sgemm_data).cstep * sVar9);
        for (uVar60 = 0; (long)(uVar60 | 3) < lVar55; uVar60 = uVar60 + 4) {
          lVar71 = 0;
          pauVar47 = pauVar83;
          for (iVar62 = 0; iVar62 + 3 < iVar49; iVar62 = iVar62 + 4) {
            puVar37 = (undefined4 *)((long)pd._vptr_ParamDict + lVar71 + lVar51);
            uVar43 = puVar37[1];
            puVar54 = (undefined4 *)((long)pd._vptr_ParamDict + lVar71 + lVar78);
            uVar12 = *puVar54;
            uVar13 = puVar54[1];
            puVar40 = (undefined4 *)((long)pd._vptr_ParamDict + lVar71 + lVar56);
            uVar14 = *puVar40;
            uVar15 = puVar40[1];
            uVar16 = puVar40[2];
            uVar17 = puVar40[3];
            puVar40 = (undefined4 *)((long)pd._vptr_ParamDict + lVar71 + lVar63);
            uVar18 = *puVar40;
            uVar19 = puVar40[1];
            uVar20 = puVar40[2];
            uVar21 = puVar40[3];
            auVar86._0_8_ = CONCAT44(puVar54[2],puVar37[2]);
            auVar86._8_4_ = puVar37[3];
            auVar86._12_4_ = puVar54[3];
            puVar54 = (undefined4 *)(*pauVar83 + lVar71 * 4);
            *puVar54 = *puVar37;
            puVar54[1] = uVar12;
            puVar54[2] = uVar14;
            puVar54[3] = uVar18;
            puVar37 = (undefined4 *)(pauVar83[1] + lVar71 * 4);
            *puVar37 = uVar43;
            puVar37[1] = uVar13;
            puVar37[2] = uVar15;
            puVar37[3] = uVar19;
            auVar11._8_4_ = uVar16;
            auVar11._0_8_ = auVar86._0_8_;
            auVar11._12_4_ = uVar20;
            *(undefined1 (*) [16])(pauVar83[2] + lVar71 * 4) = auVar11;
            auVar10._8_4_ = uVar17;
            auVar10._0_8_ = auVar86._8_8_;
            auVar10._12_4_ = uVar21;
            *(undefined1 (*) [16])(pauVar83[3] + lVar71 * 4) = auVar10;
            pauVar47 = pauVar47 + 4;
            lVar71 = lVar71 + 0x10;
          }
          for (; iVar62 < iVar49; iVar62 = iVar62 + 1) {
            *(undefined4 *)(*pauVar83 + lVar71 * 4) =
                 *(undefined4 *)((long)pd._vptr_ParamDict + lVar71 + lVar51);
            *(undefined4 *)(*pauVar83 + lVar71 * 4 + 4) =
                 *(undefined4 *)((long)pd._vptr_ParamDict + lVar71 + lVar78);
            *(undefined4 *)(*pauVar83 + lVar71 * 4 + 8) =
                 *(undefined4 *)((long)pd._vptr_ParamDict + lVar71 + lVar56);
            *(undefined4 *)(*pauVar83 + lVar71 * 4 + 0xc) =
                 *(undefined4 *)((long)pd._vptr_ParamDict + lVar71 + lVar63);
            pauVar47 = pauVar47 + 1;
            lVar71 = lVar71 + 4;
          }
          lVar63 = lVar63 + lVar38;
          lVar56 = lVar56 + lVar38;
          lVar78 = lVar78 + lVar38;
          lVar51 = lVar51 + lVar38;
          pauVar83 = pauVar47;
        }
        for (; (long)(uVar60 | 1) < lVar55; uVar60 = uVar60 + 2) {
          lVar38 = 0;
          lVar56 = 0;
          pauVar47 = pauVar83;
          for (iVar62 = 0; iVar62 + 3 < iVar49; iVar62 = iVar62 + 4) {
            puVar37 = (undefined4 *)((long)pd._vptr_ParamDict + lVar56 + lVar51);
            uVar13 = puVar37[1];
            puVar54 = (undefined4 *)((long)pd._vptr_ParamDict + lVar56 + lVar78);
            uVar43 = *puVar54;
            uVar12 = puVar54[1];
            auVar87._4_4_ = puVar54[2];
            auVar87._0_4_ = puVar37[2];
            auVar87._8_4_ = puVar37[3];
            auVar87._12_4_ = puVar54[3];
            puVar54 = (undefined4 *)(*pauVar83 + lVar56 * 2);
            *puVar54 = *puVar37;
            puVar54[1] = uVar43;
            puVar54[2] = uVar13;
            puVar54[3] = uVar12;
            *(undefined1 (*) [16])(pauVar83[1] + lVar56 * 2) = auVar87;
            pauVar47 = pauVar47 + 2;
            lVar56 = lVar56 + 0x10;
            lVar38 = lVar38 + 4;
          }
          for (; (int)lVar38 < iVar49; lVar38 = lVar38 + 1) {
            *(undefined4 *)*pauVar47 =
                 *(undefined4 *)((long)pd._vptr_ParamDict + lVar38 * 4 + lVar51);
            *(undefined4 *)(*pauVar47 + 4) =
                 *(undefined4 *)((long)pd._vptr_ParamDict + lVar38 * 4 + lVar78);
            pauVar47 = (undefined1 (*) [16])(*pauVar47 + 8);
          }
          lVar51 = lVar51 + lVar58 * 8;
          lVar78 = lVar78 + lVar58 * 8;
          pauVar83 = pauVar47;
        }
        for (; (long)uVar60 < lVar55; uVar60 = uVar60 + 1) {
          pauVar47 = (undefined1 (*) [16])
                     ((long)pd._vptr_ParamDict + uVar64 * 4 + (uVar60 + (long)local_d0) * lVar58 * 4
                     );
          lVar38 = 0;
          for (iVar62 = 0; iVar62 + 3 < iVar49; iVar62 = iVar62 + 4) {
            *pauVar83 = *pauVar47;
            pauVar83 = pauVar83 + 1;
            pauVar47 = pauVar47 + 1;
            lVar38 = lVar38 + 4;
          }
          for (; (int)lVar38 < iVar49; lVar38 = lVar38 + 1) {
            *(undefined4 *)*pauVar83 =
                 *(undefined4 *)((long)pd._vptr_ParamDict + lVar38 * 4 + lVar51);
            pauVar83 = (undefined1 (*) [16])(*pauVar83 + 4);
          }
          lVar51 = lVar51 + lVar58 * 4;
        }
        local_1a8 = local_1a8 + (long)local_e8;
      }
      local_198 = local_198 + lVar66;
      local_1a0 = local_1a0 + lVar66;
      local_190 = local_190 + lVar66;
      lVar55 = lVar53 + lVar66;
      local_c8 = lVar53;
      local_a0 = uVar69;
      uVar64 = uVar69 + 1;
    }
    piVar7 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_168 == (Allocator *)0x0) {
          free(pd._vptr_ParamDict);
        }
        else {
          (*local_168->_vptr_Allocator[3])();
        }
      }
    }
    if (opt->lightmode != true) {
      return 0;
    }
    piVar7 = (this->super_Convolution).weight_data.refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        pAVar8 = (this->super_Convolution).weight_data.allocator;
        if (pAVar8 == (Allocator *)0x0) {
          free((this->super_Convolution).weight_data.data);
        }
        else {
          (*pAVar8->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_Convolution).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_Convolution).weight_data.elemsize + 4) = 0;
    this_00->data = (void *)0x0;
    (this->super_Convolution).weight_data.refcount = (int *)0x0;
    (this->super_Convolution).weight_data.dims = 0;
    (this->super_Convolution).weight_data.w = 0;
    (this->super_Convolution).weight_data.h = 0;
    (this->super_Convolution).weight_data.d = 0;
    (this->super_Convolution).weight_data.c = 0;
    return 0;
  }
  pMVar4 = (this->super_Convolution).super_Layer.bottom_shapes.
           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if (((pMVar4 == (this->super_Convolution).super_Layer.bottom_shapes.
                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish) || (pMVar4->w == 0)) || (pMVar4->h == 0)) {
    pMVar46 = (this->super_Convolution).super_Layer.top_shapes.
              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar50 = (this->super_Convolution).super_Layer.top_shapes.
              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (((pMVar46 != pMVar50) && (pMVar46->w != 0)) && (pMVar46->h != 0)) goto LAB_0014b0a7;
    if (((0x20 < (int)uVar45) || (opt->use_winograd63_convolution == false)) || (0x20 < (int)_h)) {
      if (opt->use_winograd43_convolution != true) goto LAB_0014b625;
LAB_0014b5f0:
      conv3x3s1_winograd43_transform_kernel
                (&(this->super_Convolution).weight_data,&this->weight_winograd43_data,_h,uVar45,opt)
      ;
      goto LAB_0014b6ab;
    }
LAB_0014b68e:
    conv3x3s1_winograd63_transform_kernel
              (&(this->super_Convolution).weight_data,&this->weight_winograd63_data,_h,uVar45,opt);
  }
  else {
    pMVar46 = (this->super_Convolution).super_Layer.top_shapes.
              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar50 = (this->super_Convolution).super_Layer.top_shapes.
              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish;
LAB_0014b0a7:
    if (((pMVar46 == pMVar50) || (iVar44 = pMVar46->w, iVar44 == 0)) ||
       (iVar82 = pMVar46->h, iVar82 == 0)) {
      iVar44 = pMVar4->w;
      iVar82 = pMVar4->h;
      iVar49 = (this->super_Convolution).pad_left;
      iVar62 = (this->super_Convolution).pad_right;
      if (((iVar62 < 1 && iVar49 < 1) && (iVar1 = (this->super_Convolution).pad_top, iVar1 < 1)) &&
         (iVar2 = (this->super_Convolution).pad_bottom, iVar2 < 1)) {
        if ((iVar2 == -0xe9 && (iVar1 == -0xe9 && (iVar62 == -0xe9 && iVar49 == -0xe9))) ||
           (iVar2 == -0xea && (iVar1 == -0xea && (iVar62 == -0xea && iVar49 == -0xea))))
        goto LAB_0014b0ca;
      }
      else {
        iVar44 = iVar49 + iVar44 + iVar62;
        iVar82 = iVar82 + (this->super_Convolution).pad_top + (this->super_Convolution).pad_bottom;
      }
    }
    else {
LAB_0014b0ca:
      iVar44 = iVar44 + 2;
      iVar82 = iVar82 + 2;
    }
    bVar33 = test_prefer_winograd63(_h,uVar45,iVar44,iVar82);
    bVar32 = test_prefer_winograd23(_h,uVar45,iVar44,iVar82);
    bVar42 = bVar32 & bVar41;
    if (!bVar32) {
      bVar41 = bVar33;
    }
    if ((bool)bVar33) {
      bVar34 = opt->use_winograd63_convolution;
      if ((bVar41 & bVar34) != 0) goto LAB_0014b56f;
LAB_0014b5c7:
      if (opt->use_winograd43_convolution == false) {
        if (bVar42 == 0 && opt->use_winograd63_convolution == true) {
          bVar33 = bVar34 | opt->use_winograd63_convolution;
LAB_0014b687:
          if (bVar33 == 0) goto LAB_0014b6ab;
          goto LAB_0014b68e;
        }
      }
      else if (bVar42 == 0) goto LAB_0014b5f0;
    }
    else {
      if (bVar41 == 0) {
        bVar34 = 0;
        goto LAB_0014b5c7;
      }
LAB_0014b56f:
      if (bVar42 == 0) goto LAB_0014b687;
    }
LAB_0014b625:
    conv3x3s1_winograd23_transform_kernel
              (&(this->super_Convolution).weight_data,&this->weight_winograd23_data,_h,uVar45,opt);
  }
LAB_0014b6ab:
  if (opt->lightmode == true) {
    piVar7 = (this->super_Convolution).weight_data.refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        pAVar8 = (this->super_Convolution).weight_data.allocator;
        if (pAVar8 == (Allocator *)0x0) {
          free((this->super_Convolution).weight_data.data);
        }
        else {
          (*pAVar8->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution).weight_data.cstep = 0;
    *(undefined1 (*) [16])((long)&(this->super_Convolution).weight_data.refcount + 4) =
         (undefined1  [16])0x0;
    (this->super_Convolution).weight_data.data = (void *)0x0;
    (this->super_Convolution).weight_data.refcount = (int *)0x0;
    (this->super_Convolution).weight_data.dims = 0;
    (this->super_Convolution).weight_data.w = 0;
    (this->super_Convolution).weight_data.h = 0;
    (this->super_Convolution).weight_data.d = 0;
    (this->super_Convolution).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);
    nT = opt.num_threads;

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer_cpu(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if ((bottom_shapes.empty() || bottom_shapes[0].w == 0 || bottom_shapes[0].h == 0) && (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0))
        {
            // dynamic shape
            if ((opt.use_winograd63_convolution) && (num_input <= 32 && num_output <= 32))
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if (opt.use_winograd43_convolution)
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            int w;
            int h;
            if (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0)
            {
                w = bottom_shapes[0].w;
                h = bottom_shapes[0].h;

                // make padding
                if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
                {
                    w += pad_left + pad_right;
                    h += pad_top + pad_bottom;
                }
                else if ((pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
                         || (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234))
                {
                    // tensorflow padding=SAME or onnx padding=SAME_UPPER/SAME_LOWER
                    w += 2;
                    h += 2;
                }
            }
            else
            {
                w = top_shapes[0].w + 2;
                h = top_shapes[0].h + 2;
            }

            bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
            bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
            bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

            if (prefer_winograd23 && !opt.use_winograd23_convolution)
            {
                // f23 fallback to f43
                prefer_winograd23 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd63 && !opt.use_winograd63_convolution)
            {
                // f63 fallback to f43
                prefer_winograd63 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd43 && !opt.use_winograd43_convolution)
            {
                // f43 fallback to f63 or f23
                prefer_winograd43 = false;
                if (opt.use_winograd63_convolution)
                {
                    prefer_winograd63 = true;
                }
                else
                {
                    prefer_winograd23 = true;
                }
            }

            if (prefer_winograd23)
            {
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
            else if (prefer_winograd43)
            {
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else if (prefer_winograd63)
            {
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                // should never reach here
            }
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        convolution_im2col_gemm_transform_kernel(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h, opt);

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    if ((elempack == 16 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 8 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 8 && out_elempack == 8 && kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            || (elempack == 8 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2))
    {
        convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }
    else
    {
        convolution_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}